

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<Fad<double>_>::SolveEigenvaluesJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,REAL *tol,TPZVec<Fad<double>_> *Sort
          )

{
  Fad<double> *pFVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  double dVar3;
  double col;
  double dVar4;
  long lVar5;
  double dVar6;
  undefined1 local_298 [16];
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_288;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  undefined1 local_248 [16];
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *local_238;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_230;
  Fad<double> exps;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  TPZVec<Fad<double>_> *local_1e0;
  double local_1d8;
  double local_1d0;
  double *local_1c8;
  long *local_1c0;
  long local_1b8;
  Fad<double> *local_1b0;
  Fad<double> *local_1a8;
  Fad<double> **local_1a0;
  Fad<double> *local_198;
  Fad<double> maxval;
  Fad<double> sint;
  Fad<double> cost;
  Fad<double> Spq;
  Fad<double> aux2;
  Fad<double> aux;
  Fad<double> theta;
  Fad<double> Sqq;
  Fad<double> Spp;
  Fad<double> res;
  Fad<double> local_50;
  
  theta.val_ = (double)&myset;
  myset._M_t._M_impl._0_8_ = 0x4000000000000000;
  myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  maxval.val_ = *tol;
  theta.dx_._0_8_ = &maxval;
  maxval.dx_.num_elts = 0;
  maxval.dx_.ptr_to_data = (double *)0x0;
  maxval.defaultVal = 0.0;
  local_1e0 = Sort;
  local_1c8 = tol;
  local_1c0 = numiterations;
  Fad<double>::Fad<FadBinaryMul<Fad<double>,Fad<double>>>
            (&res,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&theta);
  Fad<double>::~Fad(&maxval);
  Fad<double>::~Fad((Fad<double> *)&myset);
  local_1d0 = (double)(this->super_TPZBaseMatrix).fRow;
  Fad<double>::Fad(&maxval);
  Fad<double>::Fad(&theta);
  Fad<double>::Fad(&cost);
  Fad<double>::Fad(&sint);
  Fad<double>::Fad(&aux);
  Fad<double>::Fad(&aux2);
  Fad<double>::Fad(&Spp);
  Fad<double>::Fad(&Sqq);
  Fad<double>::Fad(&Spq);
  local_1b8 = 0;
  local_1d8 = 0.0;
  if (0 < (long)local_1d0) {
    local_1d8 = local_1d0;
  }
  dVar4 = -NAN;
  dVar6 = dVar4;
  for (; local_1b8 < *local_1c0; local_1b8 = local_1b8 + 1) {
    myset._M_t._M_impl._0_8_ = 0;
    Fad<double>::operator=<double,_nullptr>(&maxval,(double *)&myset);
    for (dVar3 = 0.0; dVar3 != local_1d8; dVar3 = (double)((long)dVar3 + 1)) {
      for (col = 0.0; dVar3 != col; col = (double)((long)col + 1)) {
        pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)col);
        if (ABS(maxval.val_) < ABS(pFVar1->val_)) {
          pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)col);
          myset._M_t._M_impl._0_8_ = ABS(pFVar1->val_);
          Fad<double>::operator=<double,_nullptr>(&maxval,(double *)&myset);
          dVar4 = col;
          dVar6 = dVar3;
        }
      }
    }
    Fad<double>::operator=(&res,&maxval);
    if (ABS(res.val_) < *local_1c8) break;
    myset._M_t._M_impl._0_8_ = 0x3fe0000000000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    exps.val_ = 2.0;
    exps.dx_._0_8_ = exps.dx_._0_8_ & 0xffffffff00000000;
    exps.dx_.ptr_to_data = (double *)0x0;
    exps.defaultVal = 0.0;
    local_298._8_8_ = operator()(this,(int64_t)dVar6,(int64_t)dVar4);
    local_298._0_8_ = &exps;
    pFVar1 = operator()(this,(int64_t)dVar4,(int64_t)dVar4);
    local_230.fadexpr_.right_ = operator()(this,(int64_t)dVar6,(int64_t)dVar6);
    local_238 = &local_230;
    local_288.fadexpr_.right_ = (Fad<double> *)local_248;
    local_288.fadexpr_.left_ = (Fad<double> *)&myset;
    local_248._8_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_298;
    local_230.fadexpr_.left_ = pFVar1;
    Fad<double>::operator=
              (&theta,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                       *)&local_288);
    Fad<double>::~Fad(&exps);
    Fad<double>::~Fad((Fad<double> *)&myset);
    cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)&myset,&theta);
    Fad<double>::operator=(&cost,(FadExpr<FadFuncCos<Fad<double>_>_> *)&myset);
    Fad<double>::~Fad((Fad<double> *)&myset._M_t._M_impl.super__Rb_tree_header);
    sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)&myset,&theta);
    Fad<double>::operator=(&sint,(FadExpr<FadFuncSin<Fad<double>_>_> *)&myset);
    Fad<double>::~Fad((Fad<double> *)&myset._M_t._M_impl.super__Rb_tree_header);
    for (dVar3 = 0.0; local_1d8 != dVar3; dVar3 = (double)((long)dVar3 + 1)) {
      if ((dVar6 != dVar3) && (dVar4 != dVar3)) {
        pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)dVar6);
        Fad<double>::Fad((Fad<double> *)&myset,&cost);
        local_288.fadexpr_.left_ = pFVar1;
        local_288.fadexpr_.right_ = (Fad<double> *)&myset;
        pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)dVar4);
        Fad<double>::Fad(&exps,&sint);
        local_248._0_8_ = &local_288;
        local_298._0_8_ = pFVar1;
        local_298._8_8_ = &exps;
        local_248._8_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_298;
        Fad<double>::operator=
                  (&aux,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                         *)local_248);
        Fad<double>::~Fad(&exps);
        Fad<double>::~Fad((Fad<double> *)&myset);
        pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)dVar6);
        Fad<double>::Fad((Fad<double> *)&myset,&sint);
        local_288.fadexpr_.left_ = pFVar1;
        local_288.fadexpr_.right_ = (Fad<double> *)&myset;
        pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)dVar4);
        Fad<double>::Fad(&exps,&cost);
        local_248._0_8_ = &local_288;
        local_298._0_8_ = pFVar1;
        local_298._8_8_ = &exps;
        local_248._8_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_298;
        Fad<double>::operator=
                  (&aux2,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                          *)local_248);
        Fad<double>::~Fad(&exps);
        Fad<double>::~Fad((Fad<double> *)&myset);
        pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)dVar6);
        Fad<double>::operator=(pFVar1,&aux);
        pFVar1 = operator()(this,(int64_t)dVar6,(int64_t)dVar3);
        Fad<double>::operator=(pFVar1,&aux);
        pFVar1 = operator()(this,(int64_t)dVar3,(int64_t)dVar4);
        Fad<double>::operator=(pFVar1,&aux2);
        pFVar1 = operator()(this,(int64_t)dVar4,(int64_t)dVar3);
        Fad<double>::operator=(pFVar1,&aux2);
      }
    }
    local_298._0_8_ = operator()(this,(int64_t)dVar6,(int64_t)dVar6);
    myset._M_t._M_impl._0_8_ = 0x4000000000000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_298._8_8_ = &cost;
    local_288.fadexpr_.left_ = (Fad<double> *)local_298;
    local_288.fadexpr_.right_ = &cost;
    local_200._8_8_ = operator()(this,(int64_t)dVar6,(int64_t)dVar4);
    local_200._0_8_ = &myset;
    local_1f0._0_8_ = local_200;
    local_230.fadexpr_.left_ = (Fad<double> *)local_1f0;
    local_248._0_8_ = &local_288;
    local_248._8_8_ = &local_230;
    local_230.fadexpr_.right_ = &cost;
    local_1f0._8_8_ = &sint;
    local_1b0 = operator()(this,(int64_t)dVar4,(int64_t)dVar4);
    local_1a0 = &local_1b0;
    exps.val_ = (double)local_248;
    exps.dx_._0_8_ = &local_1a0;
    local_1a8 = &sint;
    local_198 = &sint;
    Fad<double>::operator=
              (&Spp,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                     *)&exps);
    Fad<double>::~Fad((Fad<double> *)&myset);
    local_298._0_8_ = operator()(this,(int64_t)dVar6,(int64_t)dVar6);
    myset._M_t._M_impl._0_8_ = 0x4000000000000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_298._8_8_ = &sint;
    local_288.fadexpr_.left_ = (Fad<double> *)local_298;
    local_288.fadexpr_.right_ = &sint;
    local_200._8_8_ = operator()(this,(int64_t)dVar6,(int64_t)dVar4);
    local_200._0_8_ = &myset;
    local_1f0._0_8_ = local_200;
    local_230.fadexpr_.left_ = (Fad<double> *)local_1f0;
    local_248._0_8_ = &local_288;
    local_248._8_8_ = &local_230;
    local_230.fadexpr_.right_ = &cost;
    local_1f0._8_8_ = &sint;
    local_1b0 = operator()(this,(int64_t)dVar4,(int64_t)dVar4);
    local_1a0 = &local_1b0;
    exps.val_ = (double)local_248;
    exps.dx_._0_8_ = &local_1a0;
    local_1a8 = &cost;
    local_198 = &cost;
    Fad<double>::operator=
              (&Sqq,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                     *)&exps);
    Fad<double>::~Fad((Fad<double> *)&myset);
    pFVar1 = operator()(this,(int64_t)dVar6,(int64_t)dVar6);
    local_288.fadexpr_.right_ = operator()(this,(int64_t)dVar4,(int64_t)dVar4);
    local_248._0_8_ = &local_288;
    exps.val_ = (double)local_248;
    local_288.fadexpr_.left_ = pFVar1;
    local_248._8_8_ = &cost;
    exps.dx_._0_8_ = &sint;
    local_298._0_8_ = operator()(this,(int64_t)dVar6,(int64_t)dVar4);
    local_230.fadexpr_.left_ = (Fad<double> *)local_1f0;
    local_230.fadexpr_.right_ = (Fad<double> *)local_200;
    local_298._8_8_ = &local_230;
    myset._M_t._M_impl._0_8_ = &exps;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_298;
    local_200._0_8_ = &sint;
    local_200._8_8_ = &sint;
    local_1f0._0_8_ = &cost;
    local_1f0._8_8_ = &cost;
    Fad<double>::operator=
              (&Spq,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                     *)&myset);
    pFVar1 = operator()(this,(int64_t)dVar6,(int64_t)dVar6);
    Fad<double>::operator=(pFVar1,&Spp);
    pFVar1 = operator()(this,(int64_t)dVar4,(int64_t)dVar4);
    Fad<double>::operator=(pFVar1,&Sqq);
    pFVar1 = operator()(this,(int64_t)dVar6,(int64_t)dVar4);
    Fad<double>::operator=(pFVar1,&Spq);
    pFVar1 = operator()(this,(int64_t)dVar4,(int64_t)dVar6);
    Fad<double>::operator=(pFVar1,&Spq);
  }
  if (local_1e0 != (TPZVec<Fad<double>_> *)0x0) {
    myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &myset._M_t._M_impl.super__Rb_tree_header._M_header;
    myset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    myset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (dVar4 = 0.0; dVar6 = local_1d0, local_1d8 != dVar4; dVar4 = (double)((long)dVar4 + 1)) {
      pFVar1 = operator()(this,(int64_t)dVar4,(int64_t)dVar4);
      Fad<double>::Fad(&exps,pFVar1);
      Fad<double>::Fad(&local_50,&exps);
      local_248._0_8_ = local_50.val_;
      std::
      _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
      _M_insert_equal<double>(&myset._M_t,(double *)local_248);
      Fad<double>::~Fad(&local_50);
      Fad<double>::~Fad(&exps);
    }
    (*local_1e0->_vptr_TPZVec[3])(local_1e0,local_1d0);
    p_Var2 = myset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar5 = (long)dVar6 << 5;
    while ((_Rb_tree_header *)p_Var2 != &myset._M_t._M_impl.super__Rb_tree_header) {
      Fad<double>::operator=<double,_nullptr>
                ((Fad<double> *)((long)&local_1e0->fStore[-1].val_ + lVar5),(double *)(p_Var2 + 1));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      lVar5 = lVar5 + -0x20;
    }
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
    ~_Rb_tree(&myset._M_t);
  }
  dVar4 = *local_1c8;
  *local_1c8 = ABS(res.val_);
  *local_1c0 = local_1b8;
  Fad<double>::~Fad(&Spq);
  Fad<double>::~Fad(&Sqq);
  Fad<double>::~Fad(&Spp);
  Fad<double>::~Fad(&aux2);
  Fad<double>::~Fad(&aux);
  Fad<double>::~Fad(&sint);
  Fad<double>::~Fad(&cost);
  Fad<double>::~Fad(&theta);
  Fad<double>::~Fad(&maxval);
  Fad<double>::~Fad(&res);
  return ABS(res.val_) < dVar4;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}